

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer.h
# Opt level: O1

void __thiscall
mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::VisitSum
          (ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> *this,SumExpr e)

{
  Buffer<char> *pBVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  
  pBVar1 = this->writer_->buffer_;
  uVar5 = pBVar1->size_ + 1;
  if (pBVar1->capacity_ < uVar5) {
    (**pBVar1->_vptr_Buffer)(pBVar1,uVar5);
  }
  pBVar1->ptr_[pBVar1->size_] = '(';
  pBVar1->size_ = uVar5;
  lVar6 = (long)*(int *)((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.
                               super_ExprBase.impl_ + 4);
  if (lVar6 != 0) {
    Visit(this,(NumericExpr)
               ((ExprBase *)
               ((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.impl_
               + 8))->impl_,-1);
    if ((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.impl_ + 0x10
        != (long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.impl_ +
           lVar6 * 8 + 8) {
      lVar4 = 0;
      do {
        pBVar1 = this->writer_->buffer_;
        uVar5 = pBVar1->size_ + 3;
        if (pBVar1->capacity_ < uVar5) {
          (**pBVar1->_vptr_Buffer)(pBVar1,uVar5);
        }
        pcVar2 = pBVar1->ptr_;
        sVar3 = pBVar1->size_;
        pcVar2[sVar3 + 2] = ' ';
        pcVar2 = pcVar2 + sVar3;
        pcVar2[0] = ' ';
        pcVar2[1] = '+';
        pBVar1->size_ = uVar5;
        Visit(this,(NumericExpr)
                   ((ExprBase *)
                   ((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.
                          impl_ + 0x10 + lVar4))->impl_,-1);
        lVar4 = lVar4 + 8;
      } while (lVar6 * 8 + -8 != lVar4);
    }
  }
  pBVar1 = this->writer_->buffer_;
  if (pBVar1->size_ == pBVar1->capacity_) {
    (**pBVar1->_vptr_Buffer)(pBVar1,pBVar1->size_ + 1);
  }
  sVar3 = pBVar1->size_;
  pBVar1->size_ = sVar3 + 1;
  pBVar1->ptr_[sVar3] = ')';
  return;
}

Assistant:

void ExprWriter<ExprTypes, VN>::VisitSum(SumExpr e) {
  writer_ << "(";
  typename SumExpr::iterator i = e.begin(), end = e.end();
  if (i != end) {
    Visit(*i);
    for (++i; i != end; ++i) {
      writer_ << " + ";
      Visit(*i);
    }
  }
  writer_ << ')';
}